

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O3

void tcmalloc::ThreadCache::GlobalInit(void)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long *plVar5;
  int iVar6;
  long lVar7;
  
  if (global_inited == '\0') {
    plVar5 = (long *)(central_freelists + 0x9a0);
    iVar6 = 1;
    lVar7 = 0;
    do {
      *(int *)(plVar5 + -0x96) = iVar6;
      lVar1 = *(long *)((long)&DAT_0010a038 + lVar7);
      plVar5[-0x95] = *(long *)((long)&DAT_0010a040 + lVar7);
      plVar5[-0x94] = lVar1;
      lVar2 = *(long *)((long)&DAT_0010a048 + lVar7);
      plVar5[-0x93] = lVar2;
      *(undefined4 *)((long)plVar5 + -100) = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = lVar2 * lVar1;
      uVar4 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100000)) / auVar3,0);
      if (uVar4 < 2) {
        uVar4 = 1;
      }
      if (0x3f < uVar4) {
        uVar4 = 0x40;
      }
      *(uint *)(plVar5 + -0xd) = uVar4;
      plVar5[-0xc] = 0;
      plVar5[-0xb] = 0;
      plVar5[-10] = (long)(plVar5 + -10);
      plVar5[-9] = (long)(plVar5 + -10);
      plVar5[-1] = (long)(plVar5 + -1);
      *plVar5 = (long)(plVar5 + -1);
      plVar5 = plVar5 + 0x9e;
      iVar6 = iVar6 + 1;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x7f8);
    pthread_key_create(&spec_key,DestroyThreadCache);
    cache_list._4144_8_ = cache_list;
    cache_list._4152_8_ = cache_list;
    next_cache_steal = cache_list;
    global_inited = 1;
    return;
  }
  __assert_fail("!global_inited",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                ,0xdf,"static void tcmalloc::ThreadCache::GlobalInit()");
}

Assistant:

static void GlobalInit() {
        assert(!global_inited);
        for (int cl = 1; cl < kMaxClass; ++cl) {
            central_freelists[cl].Init(cl);
        }
        pthread_key_create(&spec_key, DestroyThreadCache);
        CacheListInit(&cache_list);
        next_cache_steal = &cache_list;
        global_inited = true;
    }